

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O1

Duration absl::lts_20240722::Floor(Duration d,Duration unit)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  HiRep HVar4;
  HiRep HVar5;
  Duration rhs;
  Duration local_30;
  
  uVar2 = unit.rep_lo_;
  HVar4 = unit.rep_hi_;
  local_30 = Trunc(d,unit);
  if (local_30.rep_hi_ == d.rep_hi_) {
    bVar1 = d.rep_lo_ < local_30.rep_lo_;
  }
  else {
    bVar1 = (long)d.rep_hi_ < (long)local_30.rep_hi_;
  }
  if (bVar1) {
    HVar5 = HVar4;
    uVar3 = uVar2;
    if ((long)HVar4 < 0) {
      uVar3 = 0xffffffff;
      HVar5.lo_ = 0xffffffff;
      HVar5.hi_ = 0x7fffffff;
      if (uVar2 != 0xffffffff) {
        if (uVar2 == 0) {
          HVar5 = (HiRep)-(long)HVar4;
          uVar3 = 0;
        }
        else {
          HVar5 = (HiRep)~(ulong)HVar4;
          uVar3 = 4000000000 - uVar2;
        }
      }
    }
    rhs.rep_lo_ = uVar3;
    rhs.rep_hi_ = HVar5;
    Duration::operator-=(&local_30,rhs);
  }
  return local_30;
}

Assistant:

Duration Floor(const Duration d, const Duration unit) {
  const absl::Duration td = Trunc(d, unit);
  return td <= d ? td : td - AbsDuration(unit);
}